

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

ssize_t pread_failure_cb(void *ctx,filemgr_ops *normal_ops,int fd,void *buf,size_t count,
                        cs_off_t offset)

{
  int *piVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  int *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  fail_ctx_t *wctx;
  ssize_t local_8;
  
  in_RDI[1] = in_RDI[1] + 1;
  if (in_RDI[2] < in_RDI[1]) {
    *in_RDI = *in_RDI + 1;
    piVar1 = __errno_location();
    *piVar1 = -2;
    local_8 = -5;
  }
  else {
    local_8 = (**(code **)(in_RSI + 0x10))(in_EDX,in_RCX,in_R8,in_R9);
  }
  return local_8;
}

Assistant:

ssize_t pread_failure_cb(void *ctx, struct filemgr_ops *normal_ops,
                         int fd, void *buf, size_t count, cs_off_t offset)
{
    fail_ctx_t *wctx = (fail_ctx_t *)ctx;
    wctx->num_ops++;
    if (wctx->num_ops > wctx->start_failing_after) {
        wctx->num_fails++;
        errno = -2;
        return (ssize_t)FDB_RESULT_READ_FAIL;
    }
    return normal_ops->pread(fd, buf, count, offset);
}